

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5Bm25Function(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                     sqlite3_value **apVal)

{
  bool bVar1;
  double local_98;
  int local_8c;
  double dStack_88;
  int nTok;
  double w;
  int local_78;
  int io;
  int ic;
  int ip;
  double *aFreq;
  double D;
  int nInst;
  int i;
  Fts5Bm25Data *pData;
  double score;
  undefined8 uStack_40;
  int rc;
  double b;
  double k1;
  sqlite3_value **apVal_local;
  sqlite3_context *psStack_20;
  int nVal_local;
  sqlite3_context *pCtx_local;
  Fts5Context *pFts_local;
  Fts5ExtensionApi *pApi_local;
  
  b = 1.2;
  uStack_40 = 0x3fe8000000000000;
  score._4_4_ = 0;
  pData = (Fts5Bm25Data *)0x0;
  D._0_4_ = 0;
  aFreq = (double *)0x0;
  _ic = (double *)0x0;
  k1 = (double)apVal;
  apVal_local._4_4_ = nVal;
  psStack_20 = pCtx;
  pCtx_local = (sqlite3_context *)pFts;
  pFts_local = (Fts5Context *)pApi;
  score._4_4_ = fts5Bm25GetData(pApi,pFts,(Fts5Bm25Data **)&nInst);
  if (score._4_4_ == 0) {
    _ic = _nInst->aFreq;
    memset(_ic,0,(long)_nInst->nPhrase << 3);
    score._4_4_ = (**(code **)(pFts_local + 0x40))(pCtx_local,&D);
  }
  for (D._4_4_ = 0; score._4_4_ == 0 && D._4_4_ < D._0_4_; D._4_4_ = D._4_4_ + 1) {
    score._4_4_ = (**(code **)(pFts_local + 0x48))(pCtx_local,D._4_4_,&io,&local_78,(long)&w + 4);
    if (score._4_4_ == 0) {
      if (local_78 < apVal_local._4_4_) {
        local_98 = sqlite3_value_double(*(sqlite3_value **)((long)k1 + (long)local_78 * 8));
      }
      else {
        local_98 = 1.0;
      }
      dStack_88 = local_98;
      _ic[io] = local_98 + _ic[io];
    }
  }
  if (score._4_4_ == 0) {
    score._4_4_ = (**(code **)(pFts_local + 0x60))(pCtx_local,0xffffffff,&local_8c);
    aFreq = (double *)(double)local_8c;
  }
  D._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (score._4_4_ == 0) {
      bVar1 = D._4_4_ < _nInst->nPhrase;
    }
    if (!bVar1) break;
    pData = (Fts5Bm25Data *)
            (_nInst->aIDF[D._4_4_] *
             ((_ic[D._4_4_] * 2.2) /
             ((((double)aFreq * 0.75) / _nInst->avgdl + 0.25) * 1.2 + _ic[D._4_4_])) + (double)pData
            );
    D._4_4_ = D._4_4_ + 1;
  }
  if (score._4_4_ == 0) {
    sqlite3_result_double(psStack_20,(double)pData * -1.0);
  }
  else {
    sqlite3_result_error_code(psStack_20,score._4_4_);
  }
  return;
}

Assistant:

static void fts5Bm25Function(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  const double k1 = 1.2;          /* Constant "k1" from BM25 formula */
  const double b = 0.75;          /* Constant "b" from BM25 formula */
  int rc = SQLITE_OK;             /* Error code */
  double score = 0.0;             /* SQL function return value */
  Fts5Bm25Data *pData;            /* Values allocated/calculated once only */
  int i;                          /* Iterator variable */
  int nInst = 0;                  /* Value returned by xInstCount() */
  double D = 0.0;                 /* Total number of tokens in row */
  double *aFreq = 0;              /* Array of phrase freq. for current row */

  /* Calculate the phrase frequency (symbol "f(qi,D)" in the documentation)
  ** for each phrase in the query for the current row. */
  rc = fts5Bm25GetData(pApi, pFts, &pData);
  if( rc==SQLITE_OK ){
    aFreq = pData->aFreq;
    memset(aFreq, 0, sizeof(double) * pData->nPhrase);
    rc = pApi->xInstCount(pFts, &nInst);
  }
  for(i=0; rc==SQLITE_OK && i<nInst; i++){
    int ip; int ic; int io;
    rc = pApi->xInst(pFts, i, &ip, &ic, &io);
    if( rc==SQLITE_OK ){
      double w = (nVal > ic) ? sqlite3_value_double(apVal[ic]) : 1.0;
      aFreq[ip] += w;
    }
  }

  /* Figure out the total size of the current row in tokens. */
  if( rc==SQLITE_OK ){
    int nTok;
    rc = pApi->xColumnSize(pFts, -1, &nTok);
    D = (double)nTok;
  }

  /* Determine the BM25 score for the current row. */
  for(i=0; rc==SQLITE_OK && i<pData->nPhrase; i++){
    score += pData->aIDF[i] * (
      ( aFreq[i] * (k1 + 1.0) ) / 
      ( aFreq[i] + k1 * (1 - b + b * D / pData->avgdl) )
    );
  }
  
  /* If no error has occurred, return the calculated score. Otherwise,
  ** throw an SQL exception.  */
  if( rc==SQLITE_OK ){
    sqlite3_result_double(pCtx, -1.0 * score);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
}